

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O0

void secp256k1_ecdsa_signature_save
               (secp256k1_ecdsa_signature *sig,secp256k1_scalar *r,secp256k1_scalar *s)

{
  secp256k1_scalar *s_local;
  secp256k1_scalar *r_local;
  secp256k1_ecdsa_signature *sig_local;
  
  *(uint64_t *)sig->data = r->d[0];
  *(uint64_t *)(sig->data + 8) = r->d[1];
  *(uint64_t *)(sig->data + 0x10) = r->d[2];
  *(uint64_t *)(sig->data + 0x18) = r->d[3];
  *(uint64_t *)(sig->data + 0x20) = s->d[0];
  *(uint64_t *)(sig->data + 0x28) = s->d[1];
  *(uint64_t *)(sig->data + 0x30) = s->d[2];
  *(uint64_t *)(sig->data + 0x38) = s->d[3];
  return;
}

Assistant:

static void secp256k1_ecdsa_signature_save(secp256k1_ecdsa_signature* sig, const secp256k1_scalar* r, const secp256k1_scalar* s) {
    if (sizeof(secp256k1_scalar) == 32) {
        memcpy(&sig->data[0], r, 32);
        memcpy(&sig->data[32], s, 32);
    } else {
        secp256k1_scalar_get_b32(&sig->data[0], r);
        secp256k1_scalar_get_b32(&sig->data[32], s);
    }
}